

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O2

int poptStrippedArgv(poptContext con,int argc,char **argv)

{
  int iVar1;
  int numargs;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  
  iVar1 = argc;
  if (con->arg_strip != (pbm_set *)0x0) {
    uVar4 = 1;
    while (uVar3 = (uint)uVar4, (int)uVar3 < argc) {
      iVar1 = iVar1 - (uint)((con->arg_strip[uVar4 >> 5].bits[0] >> (uVar3 & 0x1f) & 1) != 0);
      uVar4 = (ulong)(uVar3 + 1);
    }
  }
  iVar2 = 1;
  for (uVar4 = 1; (long)uVar4 < (long)argc; uVar4 = uVar4 + 1) {
    if ((con->arg_strip == (pbm_set *)0x0) ||
       ((con->arg_strip[uVar4 >> 5 & 0x7ffffff].bits[0] >> ((uint)uVar4 & 0x1f) & 1) == 0)) {
      if (iVar2 < iVar1) {
        pcVar5 = argv[uVar4];
      }
      else {
        pcVar5 = (char *)0x0;
      }
      argv[iVar2] = pcVar5;
      iVar2 = iVar2 + 1;
    }
  }
  return iVar1;
}

Assistant:

int poptStrippedArgv(poptContext con, int argc, char ** argv)
{
    int numargs = argc;
    int j = 1;
    int i;
    
    if (con->arg_strip)
    for (i = 1; i < argc; i++) {
	if (PBM_ISSET(i, con->arg_strip))
	    numargs--;
    }
    
    for (i = 1; i < argc; i++) {
	if (con->arg_strip && PBM_ISSET(i, con->arg_strip))
	    continue;
	argv[j] = (j < numargs) ? argv[i] : NULL;
	j++;
    }
    
    return numargs;
}